

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O3

void __thiscall IntersectionHelper::step_single(IntersectionHelper *this)

{
  uint *puVar1;
  uint *puVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  
  pbVar3 = this->run_it_;
  uVar6 = *pbVar3 & 0x7f;
  if ((char)*pbVar3 < '\0') {
    bVar4 = 7;
    pbVar7 = pbVar3;
    do {
      pbVar7 = pbVar7 + 1;
      uVar6 = uVar6 + ((*pbVar7 & 0x7f) << (bVar4 & 0x1f));
      bVar4 = bVar4 + 7;
    } while ((char)*pbVar7 < '\0');
  }
  uVar5 = this->prev_ + uVar6 + 1;
  puVar1 = this->seq_it_;
  uVar6 = *puVar1;
  if (uVar5 < uVar6) {
    this->prev_ = uVar5;
    do {
      bVar4 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while ((char)bVar4 < '\0');
    this->run_it_ = pbVar3;
    return;
  }
  if (uVar5 == uVar6) {
    puVar2 = this->seq_out_;
    this->seq_out_ = puVar2 + 1;
    *puVar2 = uVar5;
    this->prev_ = uVar5;
    do {
      bVar4 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while ((char)bVar4 < '\0');
    this->run_it_ = pbVar3;
  }
  this->seq_it_ = puVar1 + 1;
  return;
}

Assistant:

void IntersectionHelper::step_single() {
    uint32_t next = prev_ + run_read(run_it_);
    if (next < *seq_it_) {
        prev_ = next;
        run_it_ = run_forward(run_it_);
        return;
    }
    if (*seq_it_ == next) {
        *seq_out_++ = *seq_it_;
        prev_ = next;
        run_it_ = run_forward(run_it_);
    }
    seq_it_++;
}